

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall Js::ObjectVariablesWalker::PopulateMembers(ObjectVariablesWalker *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 extraout_var;
  ArenaAllocator *alloc;
  undefined4 *puVar5;
  RecyclableObject *instance;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar6;
  
  if (((this->super_VariableWalkerBase).pMembersList !=
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) || ((this->super_VariableWalkerBase).instance == (Var)0x0)) {
    return;
  }
  iVar3 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
  alloc = GetArenaFromContext((ScriptContext *)CONCAT44(extraout_var,iVar3));
  bVar2 = VarIs<Js::RecyclableObject>((this->super_VariableWalkerBase).instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x337,"(Js::VarIs<Js::RecyclableObject>(instance))",
                                "Js::VarIs<Js::RecyclableObject>(instance)");
    if (!bVar2) goto LAB_008be780;
    *puVar5 = 0;
  }
  instance = VarTo<Js::RecyclableObject>((this->super_VariableWalkerBase).instance);
  BVar4 = JavascriptOperators::IsObject(instance);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x33a,"(JavascriptOperators::IsObject(object))",
                                "JavascriptOperators::IsObject(object)");
    if (!bVar2) {
LAB_008be780:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  iVar3 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[10])(instance);
  pLVar6 = (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
  (pLVar6->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (pLVar6->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  (pLVar6->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  alloc = alloc;
  (pLVar6->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f9c80;
  pLVar6->increment = iVar3;
  pLVar6->length = 0;
  (this->super_VariableWalkerBase).pMembersList = pLVar6;
  AddObjectProperties(this,iVar3,instance);
  return;
}

Assistant:

void ObjectVariablesWalker::PopulateMembers()
    {
        if (pMembersList == nullptr && instance != nullptr)
        {
            ScriptContext * scriptContext = pFrame->GetScriptContext();
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);

            Assert(Js::VarIs<Js::RecyclableObject>(instance));

            Js::RecyclableObject* object = Js::VarTo<Js::RecyclableObject>(instance);
            Assert(JavascriptOperators::IsObject(object));

            int count = object->GetPropertyCount();
            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena, count);

            AddObjectProperties(count, object);
        }
    }